

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::write_data(Stream *strm,char *d,size_t l)

{
  ulong uVar1;
  int iVar2;
  int extraout_var;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (l <= uVar3) break;
    iVar2 = (*strm->_vptr_Stream[5])(strm,d + uVar3);
    uVar1 = CONCAT44(extraout_var,iVar2) + uVar3;
  } while (-1 < extraout_var);
  return l <= uVar3;
}

Assistant:

inline bool write_data(Stream &strm, const char *d, size_t l) {
			size_t offset = 0;
			while (offset < l) {
				auto length = strm.write(d + offset, l - offset);
				if (length < 0) { return false; }
				offset += static_cast<size_t>(length);
			}
			return true;
		}